

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

void append_entry_w(wchar_t **wp,wchar_t *prefix,wchar_t tag,wchar_t *wname,wchar_t perm,wchar_t id)

{
  undefined4 *puVar1;
  size_t sVar2;
  undefined4 uVar3;
  wchar_t *in_RCX;
  wchar_t **wp_00;
  int in_EDX;
  wchar_t *in_RSI;
  long *in_RDI;
  uint in_R8D;
  int in_R9D;
  wchar_t in_stack_ffffffffffffffcc;
  int local_28;
  wchar_t *local_20;
  
  if (in_RSI != (wchar_t *)0x0) {
    wcscpy((wchar_t *)*in_RDI,in_RSI);
    sVar2 = wcslen((wchar_t *)*in_RDI);
    *in_RDI = sVar2 * 4 + *in_RDI;
  }
  wp_00 = (wchar_t **)(ulong)(in_EDX - 0x2711);
  local_28 = in_R9D;
  local_20 = in_RCX;
  switch(wp_00) {
  case (wchar_t **)0x1:
    local_20 = (wchar_t *)0x0;
    local_28 = -1;
  case (wchar_t **)0x0:
    wcscpy((wchar_t *)*in_RDI,anon_var_dwarf_46c0c);
    break;
  case (wchar_t **)0x3:
    local_20 = (wchar_t *)0x0;
    local_28 = -1;
  case (wchar_t **)0x2:
    wcscpy((wchar_t *)*in_RDI,anon_var_dwarf_46c23);
    break;
  case (wchar_t **)0x4:
    wcscpy((wchar_t *)*in_RDI,anon_var_dwarf_46c45);
    local_20 = (wchar_t *)0x0;
    local_28 = -1;
    break;
  case (wchar_t **)0x5:
    wcscpy((wchar_t *)*in_RDI,anon_var_dwarf_46c3a);
    local_20 = (wchar_t *)0x0;
    local_28 = -1;
  }
  sVar2 = wcslen((wchar_t *)*in_RDI);
  *in_RDI = sVar2 * 4 + *in_RDI;
  puVar1 = (undefined4 *)*in_RDI;
  *in_RDI = (long)(puVar1 + 1);
  *puVar1 = 0x3a;
  if (local_20 == (wchar_t *)0x0) {
    if ((in_EDX == 0x2711) || (in_EDX == 0x2713)) {
      append_id_w(wp_00,in_stack_ffffffffffffffcc);
      local_28 = -1;
    }
  }
  else {
    wcscpy((wchar_t *)*in_RDI,local_20);
    sVar2 = wcslen((wchar_t *)*in_RDI);
    *in_RDI = sVar2 * 4 + *in_RDI;
  }
  puVar1 = (undefined4 *)*in_RDI;
  *in_RDI = (long)(puVar1 + 1);
  *puVar1 = 0x3a;
  uVar3 = 0x2d;
  if ((in_R8D & 0x124) != 0) {
    uVar3 = 0x72;
  }
  puVar1 = (undefined4 *)*in_RDI;
  *in_RDI = (long)(puVar1 + 1);
  *puVar1 = uVar3;
  uVar3 = 0x2d;
  if ((in_R8D & 0x92) != 0) {
    uVar3 = 0x77;
  }
  puVar1 = (undefined4 *)*in_RDI;
  *in_RDI = (long)(puVar1 + 1);
  *puVar1 = uVar3;
  uVar3 = 0x2d;
  if ((in_R8D & 0x49) != 0) {
    uVar3 = 0x78;
  }
  puVar1 = (undefined4 *)*in_RDI;
  *in_RDI = (long)(puVar1 + 1);
  *puVar1 = uVar3;
  if (local_28 != -1) {
    puVar1 = (undefined4 *)*in_RDI;
    *in_RDI = (long)(puVar1 + 1);
    *puVar1 = 0x3a;
    append_id_w(wp_00,in_stack_ffffffffffffffcc);
  }
  *(undefined4 *)*in_RDI = 0;
  return;
}

Assistant:

static void
append_entry_w(wchar_t **wp, const wchar_t *prefix, int tag,
    const wchar_t *wname, int perm, int id)
{
	if (prefix != NULL) {
		wcscpy(*wp, prefix);
		*wp += wcslen(*wp);
	}
	switch (tag) {
	case ARCHIVE_ENTRY_ACL_USER_OBJ:
		wname = NULL;
		id = -1;
		/* FALLTHROUGH */
	case ARCHIVE_ENTRY_ACL_USER:
		wcscpy(*wp, L"user");
		break;
	case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
		wname = NULL;
		id = -1;
		/* FALLTHROUGH */
	case ARCHIVE_ENTRY_ACL_GROUP:
		wcscpy(*wp, L"group");
		break;
	case ARCHIVE_ENTRY_ACL_MASK:
		wcscpy(*wp, L"mask");
		wname = NULL;
		id = -1;
		break;
	case ARCHIVE_ENTRY_ACL_OTHER:
		wcscpy(*wp, L"other");
		wname = NULL;
		id = -1;
		break;
	}
	*wp += wcslen(*wp);
	*(*wp)++ = L':';
	if (wname != NULL) {
		wcscpy(*wp, wname);
		*wp += wcslen(*wp);
	} else if (tag == ARCHIVE_ENTRY_ACL_USER
	    || tag == ARCHIVE_ENTRY_ACL_GROUP) {
		append_id_w(wp, id);
		id = -1;
	}
	*(*wp)++ = L':';
	*(*wp)++ = (perm & 0444) ? L'r' : L'-';
	*(*wp)++ = (perm & 0222) ? L'w' : L'-';
	*(*wp)++ = (perm & 0111) ? L'x' : L'-';
	if (id != -1) {
		*(*wp)++ = L':';
		append_id_w(wp, id);
	}
	**wp = L'\0';
}